

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuBackend.cpp
# Opt level: O1

void __thiscall xmrig::CpuBackend::setJob(CpuBackend *this,Job *job)

{
  CpuLaunchData *pCVar1;
  CpuBackendPrivate *pCVar2;
  pointer pCVar3;
  bool bVar4;
  int iVar5;
  Config *this_00;
  CpuConfig *this_01;
  Miner *miner;
  long lVar6;
  ulong uVar7;
  char *pcVar8;
  CpuLaunchData *this_02;
  CpuLaunchData *other;
  vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_> local_38;
  
  iVar5 = (*(this->super_IBackend)._vptr_IBackend[2])();
  if ((char)iVar5 == '\0') {
    (*(this->super_IBackend)._vptr_IBackend[0xb])(this);
    return;
  }
  this_00 = Base::config(&this->d_ptr->controller->super_Base);
  this_01 = Config::cpu(this_00);
  miner = Controller::miner(this->d_ptr->controller);
  CpuConfig::get(&local_38,this_01,miner);
  other = local_38.super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>.
          _M_impl.super__Vector_impl_data._M_start;
  this_02 = (this->d_ptr->threads).
            super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>._M_impl.
            super__Vector_impl_data._M_start;
  pCVar1 = (this->d_ptr->threads).
           super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (((this_02 != pCVar1) &&
      ((long)pCVar1 - (long)this_02 ==
       (long)local_38.
             super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>._M_impl
             .super__Vector_impl_data._M_finish -
       (long)local_38.
             super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>._M_impl
             .super__Vector_impl_data._M_start)) &&
     (bVar4 = CpuLaunchData::isEqual
                        (this_02,local_38.
                                 super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>
                                 ._M_impl.super__Vector_impl_data._M_start), bVar4)) {
    do {
      other = other + 1;
      this_02 = this_02 + 1;
      if (this_02 == pCVar1) goto LAB_0015cf8d;
      bVar4 = CpuLaunchData::isEqual(this_02,other);
    } while (bVar4);
  }
  if (local_38.super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      local_38.super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    Log::print(WARNING,
               "%s \x1b[1;31mdisabled\x1b[0m\x1b[0;33m (no suitable configuration found)\x1b[0m",
               "\x1b[46;1m\x1b[1;37m cpu \x1b[0m");
    (*(this->super_IBackend)._vptr_IBackend[0xb])(this);
  }
  else {
    (*(this->super_IBackend)._vptr_IBackend[0xb])(this);
    pCVar2 = this->d_ptr;
    pCVar3 = (pCVar2->threads).
             super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>._M_impl
             .super__Vector_impl_data._M_start;
    (pCVar2->threads).
    super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_38.super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>.
         _M_impl.super__Vector_impl_data._M_start;
    (pCVar2->threads).
    super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_38.super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    (pCVar2->threads).
    super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_38.super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_38.super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    local_38.super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38.super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (pCVar3 != (pointer)0x0) {
      operator_delete(pCVar3);
    }
    pCVar2 = this->d_ptr;
    uVar7 = ((long)(pCVar2->threads).
                   super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(pCVar2->threads).
                   super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
    pcVar8 = "";
    if (1 < uVar7) {
      pcVar8 = "s";
    }
    Log::print(INFO,
               "%s use profile \x1b[44m\x1b[1;37m cn/blur \x1b[0m\x1b[1;37m (\x1b[1;36m%zu\x1b[0m\x1b[1;37m thread%s)\x1b[0m scratchpad \x1b[1;36m%zu KB\x1b[0m"
               ,"\x1b[46;1m\x1b[1;37m cpu \x1b[0m",uVar7,pcVar8,0x400);
    (pCVar2->status).m_memory = 0x100000;
    (pCVar2->status).m_errors = 0;
    (pCVar2->status).m_hugePages = 0;
    (pCVar2->status).m_pages = 0;
    (pCVar2->status).m_started = 0;
    (pCVar2->status).m_threads =
         ((long)(pCVar2->threads).
                super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(pCVar2->threads).
                super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
    (pCVar2->status).m_ways = 0;
    lVar6 = std::chrono::_V2::steady_clock::now();
    (pCVar2->status).m_ts = lVar6 / 1000000;
    Workers<xmrig::CpuLaunchData>::start(&pCVar2->workers,&pCVar2->threads);
  }
LAB_0015cf8d:
  if (local_38.super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.
                    super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void xmrig::CpuBackend::setJob(const Job &job)
{
    if (!isEnabled()) {
        return stop();
    }

    const CpuConfig &cpu = d_ptr->controller->config()->cpu();

    std::vector<CpuLaunchData> threads = cpu.get(d_ptr->controller->miner());
    if (!d_ptr->threads.empty() && d_ptr->threads.size() == threads.size() && std::equal(d_ptr->threads.begin(), d_ptr->threads.end(), threads.begin())) {
        return;
    }

    if (threads.empty()) {
        LOG_WARN("%s " RED_BOLD("disabled") YELLOW(" (no suitable configuration found)"), tag);

        return stop();
    }

    stop();

    d_ptr->threads = std::move(threads);
    d_ptr->start();
}